

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CwiseUnaryOp.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>>,3,0>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                 (redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *eval,scalar_max_op<double,_double,_0> *func,
                 CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 *xpr)

{
  double *pdVar1;
  double *pdVar2;
  Index index;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [16];
  Scalar elements [2];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  Packet2d mask;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  lVar5 = (xpr->m_xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols * (xpr->m_xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows;
  lVar3 = 4;
  pdVar2 = (eval->
           super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           ).
           super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_double>
           .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
           data;
  if (lVar5 + 1U < 3) {
    dVar7 = ABS(*pdVar2);
    for (lVar3 = 1; lVar3 < lVar5; lVar3 = lVar3 + 1) {
      dVar11 = ABS(pdVar2[lVar3]);
      if (ABS(pdVar2[lVar3]) <= dVar7) {
        dVar11 = dVar7;
      }
      dVar7 = dVar11;
    }
  }
  else {
    lVar4 = (lVar5 / 2) * 2;
    auVar13._0_8_ = ABS(*pdVar2);
    auVar13._8_8_ = ABS(pdVar2[1]);
    if (3 < lVar5) {
      lVar6 = (lVar5 / 4) * 4;
      auVar10._0_8_ = ABS(pdVar2[2]);
      auVar10._8_8_ = ABS(pdVar2[3]);
      for (; lVar3 < lVar6; lVar3 = lVar3 + 4) {
        auVar12._0_8_ = ABS(pdVar2[lVar3]);
        auVar12._8_8_ = ABS((pdVar2 + lVar3)[1]);
        auVar13 = maxpd(auVar12,auVar13);
        auVar9._0_8_ = ABS(pdVar2[lVar3 + 2]);
        auVar9._8_8_ = ABS((pdVar2 + lVar3 + 2)[1]);
        auVar10 = maxpd(auVar9,auVar10);
      }
      auVar13 = maxpd(auVar10,auVar13);
      if (lVar6 < lVar4) {
        pdVar1 = pdVar2 + (lVar5 / 4) * 4;
        auVar8._0_8_ = ABS(*pdVar1);
        auVar8._8_4_ = *(undefined4 *)(pdVar1 + 1);
        auVar8._12_4_ = *(uint *)((long)pdVar1 + 0xc) & 0x7fffffff;
        auVar13 = maxpd(auVar8,auVar13);
      }
    }
    dVar7 = auVar13._8_8_;
    if (auVar13._8_8_ <= auVar13._0_8_) {
      dVar7 = auVar13._0_8_;
    }
    for (; lVar4 < lVar5; lVar4 = lVar4 + 1) {
      dVar11 = ABS(pdVar2[lVar4]);
      if (ABS(pdVar2[lVar4]) <= dVar7) {
        dVar11 = dVar7;
      }
      dVar7 = dVar11;
    }
  }
  return dVar7;
}

Assistant:

EIGEN_CONSTEXPR
    Index rows() const EIGEN_NOEXCEPT { return m_xpr.rows(); }